

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void C_AddTabCommand(char *name)

{
  bool bVar1;
  TabData *pTVar2;
  TabData local_1c;
  TabData tab;
  int pos;
  char *name_local;
  
  unique0x1000008c = name;
  bVar1 = FindTabCommand(name,&tab.UseCount,0x7fffffff);
  if (bVar1) {
    pTVar2 = TArray<TabData,_TabData>::operator[](&TabCommands,(long)tab.UseCount);
    pTVar2->UseCount = pTVar2->UseCount + 1;
  }
  else {
    TabData::TabData(&local_1c,stack0xfffffffffffffff0);
    TArray<TabData,_TabData>::Insert(&TabCommands,tab.UseCount,&local_1c);
  }
  return;
}

Assistant:

void C_AddTabCommand (const char *name)
{
	int pos;

	if (FindTabCommand (name, &pos, INT_MAX))
	{
		TabCommands[pos].UseCount++;
	}
	else
	{
		TabData tab(name);
		TabCommands.Insert (pos, tab);
	}
}